

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp_common.c
# Opt level: O3

void set_dmsr_to_vdpp_reg(dmsr_params *p_dmsr_param,dmsr_reg *dmsr)

{
  RK_U32 RVar1;
  anon_struct_4_5_50fc2d51_for_reg15 aVar2;
  anon_struct_4_7_af68cc2a_for_reg17 aVar3;
  anon_struct_4_5_d54b5079_for_reg19 aVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  RK_U16 adj_mapping_k [7];
  
  uVar10 = p_dmsr_param->dmsr_edge_th_low_arr[0];
  *(short *)&dmsr->reg0 = (short)uVar10;
  dmsr->reg0 = (anon_struct_4_2_bd67da7d_for_reg0)
               (p_dmsr_param->dmsr_edge_th_high_arr[0] << 0x10 | uVar10 & 0xffff);
  uVar10 = p_dmsr_param->dmsr_edge_th_low_arr[1];
  *(short *)&dmsr->reg1 = (short)uVar10;
  dmsr->reg1 = (anon_struct_4_2_bd67da9d_for_reg1)
               (p_dmsr_param->dmsr_edge_th_high_arr[1] << 0x10 | uVar10 & 0xffff);
  uVar10 = p_dmsr_param->dmsr_edge_th_low_arr[2];
  *(short *)&dmsr->reg2 = (short)uVar10;
  dmsr->reg2 = (anon_struct_4_2_bd67dabd_for_reg2)
               (p_dmsr_param->dmsr_edge_th_high_arr[2] << 0x10 | uVar10 & 0xffff);
  uVar10 = p_dmsr_param->dmsr_edge_th_low_arr[3];
  *(short *)&dmsr->reg3 = (short)uVar10;
  dmsr->reg3 = (anon_struct_4_2_bd67dadd_for_reg3)
               (p_dmsr_param->dmsr_edge_th_high_arr[3] << 0x10 | uVar10 & 0xffff);
  uVar10 = p_dmsr_param->dmsr_edge_th_low_arr[4];
  *(short *)&dmsr->reg4 = (short)uVar10;
  dmsr->reg4 = (anon_struct_4_2_bd67dafd_for_reg4)
               (p_dmsr_param->dmsr_edge_th_high_arr[4] << 0x10 | uVar10 & 0xffff);
  uVar10 = p_dmsr_param->dmsr_edge_th_low_arr[5];
  *(short *)&dmsr->reg5 = (short)uVar10;
  dmsr->reg5 = (anon_struct_4_2_bd67db1d_for_reg5)
               (p_dmsr_param->dmsr_edge_th_high_arr[5] << 0x10 | uVar10 & 0xffff);
  uVar10 = p_dmsr_param->dmsr_edge_th_low_arr[6];
  *(short *)&dmsr->reg6 = (short)uVar10;
  dmsr->reg6 = (anon_struct_4_2_bd67db3d_for_reg6)
               (p_dmsr_param->dmsr_edge_th_high_arr[6] << 0x10 | uVar10 & 0xffff);
  lVar9 = 0;
  do {
    uVar10 = p_dmsr_param->dmsr_edge_th_high_arr[lVar9] - p_dmsr_param->dmsr_edge_th_low_arr[lVar9]
             & 0xffff;
    adj_mapping_k[lVar9] = (RK_U16)(0xffff / (uVar10 + (uVar10 == 0) & 0xffff));
    lVar9 = lVar9 + 1;
  } while (lVar9 != 7);
  iVar8 = p_dmsr_param->dmsr_contrast_to_conf_map_x1 - p_dmsr_param->dmsr_contrast_to_conf_map_x0;
  uVar7 = ((p_dmsr_param->dmsr_contrast_to_conf_map_y1 - p_dmsr_param->dmsr_contrast_to_conf_map_y0)
          * 0x100) / (iVar8 + (uint)(iVar8 == 0));
  uVar10 = 0xffff;
  if (uVar7 < 0xffff) {
    uVar10 = uVar7;
  }
  dmsr->reg7 = (anon_struct_4_2_c383ae62_for_reg7)adj_mapping_k._0_4_;
  dmsr->reg8 = (anon_struct_4_2_c383aea2_for_reg8)adj_mapping_k._4_4_;
  dmsr->reg9 = (anon_struct_4_2_c383aee2_for_reg9)adj_mapping_k._8_4_;
  uVar10 = uVar10 << 0x10;
  if ((int)uVar7 < 0) {
    uVar10 = 0;
  }
  dmsr->reg10 = (anon_struct_4_2_93f70aa1_for_reg10)(uVar10 | adj_mapping_k[6]);
  uVar10 = p_dmsr_param->dmsr_contrast_to_conf_map_x0;
  *(short *)&dmsr->reg11 = (short)uVar10;
  dmsr->reg11 = (anon_struct_4_2_bb5d8022_for_reg11)
                (p_dmsr_param->dmsr_contrast_to_conf_map_x1 << 0x10 | uVar10 & 0xffff);
  uVar10 = p_dmsr_param->dmsr_contrast_to_conf_map_y0;
  *(short *)&dmsr->reg12 = (short)uVar10;
  dmsr->reg12 = (anon_struct_4_2_bb5d8402_for_reg12)
                (p_dmsr_param->dmsr_contrast_to_conf_map_y1 << 0x10 | uVar10 & 0xffff);
  *(short *)&dmsr->reg13 = (short)p_dmsr_param->dmsr_blk_flat_th;
  RVar1 = p_dmsr_param->dmsr_diff_core_th0;
  *(char *)&dmsr->reg14 = (char)RVar1;
  *(ushort *)&dmsr->reg14 = (ushort)(p_dmsr_param->dmsr_diff_core_th1 << 8) | (ushort)RVar1 & 0xff;
  aVar2 = dmsr->reg15;
  uVar10 = p_dmsr_param->dmsr_diff_core_wgt0 & 0x3f;
  dmsr->reg15 = (anon_struct_4_5_50fc2d51_for_reg15)((uint)aVar2 & 0xffffffc0 | uVar10);
  uVar7 = (p_dmsr_param->dmsr_diff_core_wgt1 & 0x3f) << 8;
  dmsr->reg15 = (anon_struct_4_5_50fc2d51_for_reg15)((uint)aVar2 & 0xffffc0c0 | uVar10 | uVar7);
  dmsr->reg15 = (anon_struct_4_5_50fc2d51_for_reg15)
                ((uint)aVar2 & 0xffc0c0c0 | uVar10 | uVar7 |
                (p_dmsr_param->dmsr_diff_core_wgt2 & 0x3f) << 0x10);
  uVar10 = p_dmsr_param->dmsr_diff_core_wgt0 * p_dmsr_param->dmsr_diff_core_th0;
  dmsr->reg16 = (anon_struct_4_4_11ca9163_for_reg16)
                (((p_dmsr_param->dmsr_diff_core_th1 - p_dmsr_param->dmsr_diff_core_th0) *
                  p_dmsr_param->dmsr_diff_core_wgt1 + uVar10 & 0x3fff) << 0x10 |
                (uint)dmsr->reg16 & 0xc000c000 | uVar10 & 0x3fff);
  aVar3 = dmsr->reg17;
  uVar10 = p_dmsr_param->dmsr_wgt_pri_gain_odd_1 & 0x3f;
  dmsr->reg17 = (anon_struct_4_7_af68cc2a_for_reg17)((uint)aVar3 & 0xffffffc0 | uVar10);
  uVar7 = (p_dmsr_param->dmsr_wgt_pri_gain_even_1 & 0x3f) << 8;
  dmsr->reg17 = (anon_struct_4_7_af68cc2a_for_reg17)((uint)aVar3 & 0xffffc0c0 | uVar10 | uVar7);
  uVar11 = (p_dmsr_param->dmsr_wgt_pri_gain_odd_2 & 0x3f) << 0x10;
  dmsr->reg17 = (anon_struct_4_7_af68cc2a_for_reg17)
                ((uint)aVar3 & 0xffc0c0c0 | uVar10 | uVar7 | uVar11);
  dmsr->reg17 = (anon_struct_4_7_af68cc2a_for_reg17)
                ((uint)aVar3 & 0xc0c0c0c0 | uVar10 | uVar7 | uVar11 |
                (p_dmsr_param->dmsr_wgt_pri_gain_even_2 & 0x3f) << 0x18);
  uVar5 = (ushort)p_dmsr_param->dmsr_wgt_sec_gain & 0x3f;
  uVar6 = SUB42(dmsr->reg18,0);
  *(ushort *)&dmsr->reg18 = uVar6 & 0xffc0 | uVar5;
  *(ushort *)&dmsr->reg18 =
       uVar6 & 0xc0c0 | uVar5 | (ushort)((p_dmsr_param->dmsr_wgt_sec_gain & 0x1f) << 9);
  aVar4 = dmsr->reg19;
  uVar10 = p_dmsr_param->dmsr_str_pri_y & 0x1f;
  dmsr->reg19 = (anon_struct_4_5_d54b5079_for_reg19)((uint)aVar4 & 0xffffffe0 | uVar10);
  uVar7 = (p_dmsr_param->dmsr_str_sec_y & 0x1f) << 8;
  dmsr->reg19 = (anon_struct_4_5_d54b5079_for_reg19)((uint)aVar4 & 0xffffe0e0 | uVar10 | uVar7);
  dmsr->reg19 = (anon_struct_4_5_d54b5079_for_reg19)
                ((uint)aVar4 & 0xfff0e0e0 | uVar10 | uVar7 |
                (p_dmsr_param->dmsr_dumping_y & 0xf) << 0x10);
  return;
}

Assistant:

void set_dmsr_to_vdpp_reg(struct dmsr_params* p_dmsr_param, struct dmsr_reg* dmsr)
{
    /* 0x0080(reg0) */
    dmsr->reg0.sw_dmsr_edge_low_thre_0 = p_dmsr_param->dmsr_edge_th_low_arr[0];
    dmsr->reg0.sw_dmsr_edge_high_thre_0 = p_dmsr_param->dmsr_edge_th_high_arr[0];

    /* 0x0084(reg1) */
    dmsr->reg1.sw_dmsr_edge_low_thre_1 = p_dmsr_param->dmsr_edge_th_low_arr[1];
    dmsr->reg1.sw_dmsr_edge_high_thre_1 = p_dmsr_param->dmsr_edge_th_high_arr[1];

    /* 0x0088(reg2) */
    dmsr->reg2.sw_dmsr_edge_low_thre_2 = p_dmsr_param->dmsr_edge_th_low_arr[2];
    dmsr->reg2.sw_dmsr_edge_high_thre_2 = p_dmsr_param->dmsr_edge_th_high_arr[2];

    /* 0x008C(reg3) */
    dmsr->reg3.sw_dmsr_edge_low_thre_3 = p_dmsr_param->dmsr_edge_th_low_arr[3];
    dmsr->reg3.sw_dmsr_edge_high_thre_3 = p_dmsr_param->dmsr_edge_th_high_arr[3];

    /* 0x0090(reg4) */
    dmsr->reg4.sw_dmsr_edge_low_thre_4 = p_dmsr_param->dmsr_edge_th_low_arr[4];
    dmsr->reg4.sw_dmsr_edge_high_thre_4 = p_dmsr_param->dmsr_edge_th_high_arr[4];

    /* 0x0094(reg5) */
    dmsr->reg5.sw_dmsr_edge_low_thre_5 = p_dmsr_param->dmsr_edge_th_low_arr[5];
    dmsr->reg5.sw_dmsr_edge_high_thre_5 = p_dmsr_param->dmsr_edge_th_high_arr[5];

    /* 0x0098(reg6) */
    dmsr->reg6.sw_dmsr_edge_low_thre_6 = p_dmsr_param->dmsr_edge_th_low_arr[6];
    dmsr->reg6.sw_dmsr_edge_high_thre_6 = p_dmsr_param->dmsr_edge_th_high_arr[6];
    {
        RK_U16 adj_mapping_k[7];
        RK_U16 tmp_diff;
        RK_U16 i;
        RK_U16 contrast2conf_mapping_k;
        RK_U32 tmp_diff_y, tmp_diff_x;

        for (i = 0; i < 7; i++) {
            tmp_diff =  p_dmsr_param->dmsr_edge_th_high_arr[i] - p_dmsr_param->dmsr_edge_th_low_arr[i];
            adj_mapping_k[i] = (65535 / MPP_MAX(1, tmp_diff));
        }
        tmp_diff_y = p_dmsr_param->dmsr_contrast_to_conf_map_y1 - p_dmsr_param->dmsr_contrast_to_conf_map_y0;
        tmp_diff_x = MPP_MAX(p_dmsr_param->dmsr_contrast_to_conf_map_x1 - p_dmsr_param->dmsr_contrast_to_conf_map_x0, 1);

        contrast2conf_mapping_k = mpp_clip(256 * tmp_diff_y / tmp_diff_x, 0, 65535);
        /* 0x009C(reg7) */
        dmsr->reg7.sw_dmsr_edge_k_0 = adj_mapping_k[0];
        dmsr->reg7.sw_dmsr_edge_k_1 = adj_mapping_k[1];

        /* 0x00A0(reg8) */
        dmsr->reg8.sw_dmsr_edge_k_2 = adj_mapping_k[2];
        dmsr->reg8.sw_dmsr_edge_k_3 = adj_mapping_k[3];

        /* 0x00A4(reg9) */
        dmsr->reg9.sw_dmsr_edge_k_4 = adj_mapping_k[4];
        dmsr->reg9.sw_dmsr_edge_k_5 = adj_mapping_k[5];

        /* 0x00A8(reg10) */
        dmsr->reg10.sw_dmsr_edge_k_6 = adj_mapping_k[6];
        dmsr->reg10.sw_dmsr_dir_contrast_conf_f = contrast2conf_mapping_k;
    }
    /* 0x00AC(reg11) */
    dmsr->reg11.sw_dmsr_dir_contrast_conf_x0 = p_dmsr_param->dmsr_contrast_to_conf_map_x0;
    dmsr->reg11.sw_dmsr_dir_contrast_conf_x1 = p_dmsr_param->dmsr_contrast_to_conf_map_x1;

    /* 0x00B0(reg12) */
    dmsr->reg12.sw_dmsr_dir_contrast_conf_y0 = p_dmsr_param->dmsr_contrast_to_conf_map_y0;
    dmsr->reg12.sw_dmsr_dir_contrast_conf_y1 = p_dmsr_param->dmsr_contrast_to_conf_map_y1;

    /* 0x00B4(reg13) */
    dmsr->reg13.sw_dmsr_var_th = p_dmsr_param->dmsr_blk_flat_th;

    /* 0x00B8(reg14) */
    dmsr->reg14.sw_dmsr_diff_coring_th0 = p_dmsr_param->dmsr_diff_core_th0;
    dmsr->reg14.sw_dmsr_diff_coring_th1 = p_dmsr_param->dmsr_diff_core_th1;

    /* 0x00BC(reg15) */
    dmsr->reg15.sw_dmsr_diff_coring_wgt0 = p_dmsr_param->dmsr_diff_core_wgt0;
    dmsr->reg15.sw_dmsr_diff_coring_wgt1 = p_dmsr_param->dmsr_diff_core_wgt1;
    dmsr->reg15.sw_dmsr_diff_coring_wgt2 = p_dmsr_param->dmsr_diff_core_wgt2;
    {
        RK_U16 diff_coring_y0 = p_dmsr_param->dmsr_diff_core_th0 * p_dmsr_param->dmsr_diff_core_wgt0;
        RK_U16 diff_coring_y1 = ((p_dmsr_param->dmsr_diff_core_th1 - p_dmsr_param->dmsr_diff_core_th0) * p_dmsr_param->dmsr_diff_core_wgt1) + diff_coring_y0;
        /* 0x00C0(reg16) */
        dmsr->reg16.sw_dmsr_diff_coring_y0 = diff_coring_y0;
        dmsr->reg16.sw_dmsr_diff_coring_y1 = diff_coring_y1;
    }
    /* 0x00C4(reg17) */
    dmsr->reg17.sw_dmsr_wgt_pri_gain_1_odd = p_dmsr_param->dmsr_wgt_pri_gain_odd_1;
    dmsr->reg17.sw_dmsr_wgt_pri_gain_1_even = p_dmsr_param->dmsr_wgt_pri_gain_even_1;
    dmsr->reg17.sw_dmsr_wgt_pri_gain_2_odd = p_dmsr_param->dmsr_wgt_pri_gain_odd_2;
    dmsr->reg17.sw_dmsr_wgt_pri_gain_2_even = p_dmsr_param->dmsr_wgt_pri_gain_even_2;

    /* 0x00C8(reg18) */
    dmsr->reg18.sw_dmsr_wgt_sec_gain_1 = p_dmsr_param->dmsr_wgt_sec_gain;
    dmsr->reg18.sw_dmsr_wgt_sec_gain_2 = p_dmsr_param->dmsr_wgt_sec_gain * 2;

    /* 0x00CC(reg19) */
    dmsr->reg19.sw_dmsr_strength_pri = p_dmsr_param->dmsr_str_pri_y;
    dmsr->reg19.sw_dmsr_strength_sec = p_dmsr_param->dmsr_str_sec_y;
    dmsr->reg19.sw_dmsr_dump = p_dmsr_param->dmsr_dumping_y;
}